

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_free.c
# Opt level: O0

void lyd_free_tree(lyd_node *node)

{
  lysc_node *local_28;
  ly_ctx *local_18;
  lyd_node *node_local;
  
  if (node != (lyd_node *)0x0) {
    if ((((node->schema == (lysc_node *)0x0) || (node->schema->nodetype != 4)) ||
        ((node->schema->flags & 0x100) == 0)) || (node->parent == (lyd_node_inner *)0x0)) {
      lyd_unlink(node);
      lyd_free_subtree(node);
    }
    else {
      if (node->schema == (lysc_node *)0x0) {
        local_18 = (ly_ctx *)node[2].schema;
      }
      else {
        local_18 = node->schema->module->ctx;
      }
      if (node->schema == (lysc_node *)0x0) {
        local_28 = node[1].schema;
      }
      else {
        local_28 = (lysc_node *)node->schema->name;
      }
      ly_log(local_18,LY_LLERR,LY_EINVAL,
             "Cannot free a list key \"%s\", free the list instance instead.",local_28);
    }
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyd_free_tree(struct lyd_node *node)
{
    if (!node) {
        return;
    }

    if (lysc_is_key(node->schema) && node->parent) {
        LOGERR(LYD_CTX(node), LY_EINVAL, "Cannot free a list key \"%s\", free the list instance instead.", LYD_NAME(node));
        return;
    }

    lyd_unlink(node);
    lyd_free_subtree(node);
}